

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,RuleCharacterIterator *chars,SymbolTable *symbols,
          UnicodeString *rebuiltPat,uint32_t options,offset_in_UnicodeSet_to_subr caseClosure,
          int32_t depth,UErrorCode *ec)

{
  bool bVar1;
  bool bVar2;
  UnicodeSet *this_00;
  UBool UVar3;
  uint end;
  int iVar4;
  UChar32 UVar5;
  undefined4 uVar6;
  UnicodeSetPointer this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 uVar9;
  UnicodeSet *extraout_RAX;
  UnicodeString *pUVar8;
  code *pcVar10;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t __length;
  char16_t srcChar;
  int iVar11;
  Pos *pPVar12;
  Pos *p;
  undefined4 uVar13;
  char cVar14;
  char cVar15;
  undefined4 in_stack_0000000c;
  UnicodeSet *in_stack_00000018;
  UBool literal;
  uint local_150;
  uint local_14c;
  UnicodeSet *local_148;
  undefined8 local_140;
  undefined4 local_138;
  uint local_134;
  UnicodeSetPointer scratch;
  ConstChar16Ptr local_108;
  uint local_fc;
  Pos backup;
  UnicodeString patLocal;
  UnicodeString buf;
  undefined8 uVar7;
  
  if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                   _vptr_UObject) {
    return;
  }
  if (100 < (int)caseClosure) {
    *(undefined4 *)
     &(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject = 1;
    return;
  }
  pcVar10 = (code *)CONCAT44(in_stack_0000000c,depth);
  patLocal.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  patLocal.fUnion.fStackFields.fLengthAndFlags = 2;
  buf.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  buf.fUnion.fStackFields.fLengthAndFlags = 2;
  scratch.p = (UnicodeSet *)0x0;
  local_134 = options;
  clear(this);
  local_14c = (local_134 & 1) * 4 + 3;
  local_fc = (int)caseClosure + 1;
  bVar1 = false;
  local_138 = 2;
  cVar14 = '\0';
  local_140 = 0;
  local_150 = 0;
  pPVar12 = (Pos *)0x0;
  bVar2 = false;
  local_148 = this;
LAB_002d688e:
  iVar11 = (int)pPVar12;
  if ((char)local_140 == '\x02') goto LAB_002d704f;
  UVar3 = RuleCharacterIterator::atEnd(chars);
  if (UVar3 != '\0') {
LAB_002d7059:
    *(undefined4 *)
     &(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
         0x10002;
    goto LAB_002d7147;
  }
  literal = '\0';
  p = (Pos *)(ulong)local_14c;
  UVar3 = resemblesPropertyPattern(chars,local_14c);
  srcChar = (char16_t)pPVar12;
  if (UVar3 != '\0') {
    cVar15 = '\x02';
LAB_002d68c8:
    this_01.p = (UnicodeSet *)0x0;
LAB_002d68cb:
    if (cVar14 == '\x01') {
      if (srcChar != L'\0') goto LAB_002d7136;
      add(local_148,local_150,local_150);
      iVar11 = 0;
      p = (Pos *)(ulong)local_150;
      _appendToPat(&patLocal,local_150,'\0');
    }
    else if ((srcChar == L'-') || (iVar11 == 0x26)) {
      UnicodeString::append(&patLocal,srcChar);
      p = pPVar12;
    }
    if ((this_01.p == (UnicodeSet *)0x0) && (this_01.p = scratch.p, scratch.p == (UnicodeSet *)0x0))
    {
      this_01.p = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)p);
      if (this_01.p == (UnicodeSet *)0x0) {
        uVar13 = 7;
        scratch.p = this_01.p;
        goto LAB_002d713c;
      }
      UnicodeSet(this_01.p);
      scratch.p = this_01.p;
    }
    if (cVar15 == '\x03') {
      _toPattern(this_01.p,&patLocal,'\0');
    }
    else if (cVar15 == '\x02') {
      RuleCharacterIterator::skipIgnored(chars,local_14c);
      applyPropertyPattern(this_01.p,chars,&patLocal,(UErrorCode *)in_stack_00000018);
      if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                       _vptr_UObject) goto LAB_002d7147;
    }
    else {
      applyPattern(this_01.p,chars,symbols,&patLocal,local_134,(ulong)local_fc,depth,ec);
    }
    if ((char)local_140 == '\0') {
      operator=(local_148,this_01.p);
      bVar1 = false;
      goto LAB_002d707b;
    }
    cVar14 = '\x02';
    bVar1 = true;
    if ((short)iVar11 == 0) {
      addAll(local_148,this_01.p);
    }
    else if (iVar11 == 0x26) {
      retainAll(local_148,this_01.p);
    }
    else if (iVar11 == 0x2d) {
      removeAll(local_148,this_01.p);
    }
LAB_002d6acf:
    pPVar12 = (Pos *)0x0;
    goto LAB_002d688e;
  }
  RuleCharacterIterator::getPos(chars,&backup);
  end = RuleCharacterIterator::next(chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
  if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                   _vptr_UObject) goto LAB_002d7147;
  if ((end == 0x5b) && (literal == '\0')) {
    if ((char)local_140 == '\x01') {
      p = &backup;
      RuleCharacterIterator::setPos(chars,p);
      cVar15 = '\x01';
      goto LAB_002d68c8;
    }
    UnicodeString::append(&patLocal,L'[');
    RuleCharacterIterator::getPos(chars,&backup);
    UVar5 = RuleCharacterIterator::next(chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
    uVar7 = CONCAT44(extraout_var_00,UVar5);
    if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                     _vptr_UObject) goto LAB_002d7147;
    if ((UVar5 == 0x5e) && (literal == '\0')) {
      UnicodeString::append(&patLocal,L'^');
      RuleCharacterIterator::getPos(chars,&backup);
      UVar5 = RuleCharacterIterator::next(chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
      uVar7 = CONCAT44(extraout_var_01,UVar5);
      if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                       _vptr_UObject) goto LAB_002d7147;
      bVar2 = true;
    }
    uVar9 = (undefined7)((ulong)uVar7 >> 8);
    if ((int)uVar7 == 0x2d) {
      literal = '\x01';
      local_140 = CONCAT71(uVar9,1);
      end = 0x2d;
      goto LAB_002d6c2a;
    }
    local_140 = CONCAT71(uVar9,1);
    RuleCharacterIterator::setPos(chars,&backup);
    goto LAB_002d688e;
  }
  this_01.p = in_stack_00000018;
  __length = extraout_RDX;
  if (symbols != (SymbolTable *)0x0) {
    p = (Pos *)(ulong)end;
    iVar4 = (*symbols->_vptr_SymbolTable[3])();
    this_01.p = (UnicodeSet *)CONCAT44(extraout_var,iVar4);
    __length = extraout_RDX_00;
    if (this_01.p != (UnicodeSet *)0x0) {
      cVar15 = '\x03';
      if (((this_01.p)->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject ==
          (_func_int **)&PTR__UnicodeSet_003eda38) goto LAB_002d68cb;
      goto LAB_002d7136;
    }
  }
  uVar13 = 0x10002;
  if ((char)local_140 == '\0') goto LAB_002d713c;
  if (literal != '\0') {
LAB_002d6c2a:
    if (cVar14 == '\x02') {
      if (srcChar == L'\0') {
        cVar14 = '\x01';
        pPVar12 = (Pos *)0x0;
        local_150 = end;
        goto LAB_002d688e;
      }
    }
    else {
      if (cVar14 != '\x01') {
        if (cVar14 == '\0') {
          cVar14 = '\x01';
          local_150 = end;
        }
        goto LAB_002d688e;
      }
      if (srcChar != L'-') {
        add(local_148,local_150,local_150);
        cVar14 = '\x01';
        _appendToPat(&patLocal,local_150,'\0');
        local_150 = end;
        goto LAB_002d688e;
      }
      if ((int)local_150 < (int)end) {
        add(local_148,local_150,end);
        _appendToPat(&patLocal,local_150,'\0');
        UnicodeString::append(&patLocal,L'-');
        cVar14 = '\0';
        _appendToPat(&patLocal,end,'\0');
        goto LAB_002d6acf;
      }
    }
LAB_002d7136:
    uVar13 = 0x10002;
    goto LAB_002d713c;
  }
  if (end == 0x24) {
    RuleCharacterIterator::getPos(chars,&backup);
    UVar5 = RuleCharacterIterator::next(chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
    if (*(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                 _vptr_UObject < 1) {
      if ((symbols == (SymbolTable *)0x0) && (literal != '\0' || UVar5 != 0x5d)) {
        RuleCharacterIterator::setPos(chars,&backup);
        end = 0x24;
        goto LAB_002d6c2a;
      }
      if ((literal != '\0' || UVar5 != 0x5d) || srcChar != L'\0') goto LAB_002d7059;
      if (cVar14 == '\x01') {
        add(local_148,local_150,local_150);
        _appendToPat(&patLocal,local_150,'\0');
      }
      add(local_148,0xffff);
      UnicodeString::append(&patLocal,L'$');
      pUVar8 = UnicodeString::append(&patLocal,L']');
      local_140 = CONCAT71((int7)((ulong)pUVar8 >> 8),2);
      bVar1 = true;
      goto LAB_002d6acf;
    }
    goto LAB_002d7147;
  }
  if (end == 0x26) {
    if ((cVar14 == '\x02') && (srcChar == L'\0')) {
      pPVar12 = (Pos *)0x26;
      cVar14 = '\x02';
      goto LAB_002d688e;
    }
  }
  else {
    if (end != 0x2d) {
      if (end != 0x5d) {
        if (end == 0x7b) {
          if (srcChar == L'\0') {
            if (cVar14 == '\x01') {
              add(local_148,local_150,local_150);
              _appendToPat(&patLocal,local_150,'\0');
              __length = extraout_RDX_01;
            }
            UnicodeString::truncate(&buf,(char *)0x0,__length);
            while (UVar3 = RuleCharacterIterator::atEnd(chars), UVar3 == '\0') {
              UVar5 = RuleCharacterIterator::next
                                (chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
              if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.
                               super_UObject._vptr_UObject) goto LAB_002d7147;
              if ((UVar5 == 0x7d) && (literal == '\0')) break;
              UnicodeString::append(&buf,UVar5);
            }
            uVar6 = buf.fUnion.fFields.fLength;
            if (-1 < buf.fUnion.fStackFields.fLengthAndFlags) {
              uVar6 = (int)buf.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            if ((UVar3 == '\0') && (0 < (int)uVar6)) {
              add(local_148,&buf);
              UnicodeString::append(&patLocal,L'{');
              _appendToPat(&patLocal,&buf,'\0');
              UnicodeString::append(&patLocal,L'}');
              goto LAB_002d7047;
            }
          }
        }
        else if (end != 0x5e) goto LAB_002d6c2a;
        goto LAB_002d713c;
      }
      if (cVar14 == '\x01') {
        add(local_148,local_150,local_150);
        _appendToPat(&patLocal,local_150,'\0');
        this_01.p = extraout_RAX;
      }
      if (srcChar == L'-') {
        add(local_148,0x2d,0x2d);
        this_01.p = (UnicodeSet *)UnicodeString::append(&patLocal,L'-');
      }
      else if (iVar11 == 0x26) goto LAB_002d713c;
      local_140 = CONCAT71((int7)((ulong)this_01.p >> 8),2);
      UnicodeString::append(&patLocal,L']');
      goto LAB_002d688e;
    }
    if (srcChar == L'\0') {
      pPVar12 = (Pos *)0x2d;
      if (cVar14 != '\0') goto LAB_002d688e;
      add(local_148,0x2d,0x2d);
      UVar5 = RuleCharacterIterator::next(chars,local_14c,&literal,(UErrorCode *)in_stack_00000018);
      if (0 < *(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
                       _vptr_UObject) goto LAB_002d7147;
      if ((UVar5 == 0x5d) && (literal == '\0')) {
        local_108.p_ = L"-]";
        UnicodeString::append(&patLocal,&local_108,2);
        local_140 = CONCAT71((int7)((ulong)local_108.p_ >> 8),2);
LAB_002d7047:
        cVar14 = '\0';
        goto LAB_002d6acf;
      }
    }
  }
LAB_002d713c:
  *(undefined4 *)
   &(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject =
       uVar13;
  goto LAB_002d7147;
LAB_002d704f:
  bVar1 = !bVar1;
LAB_002d707b:
  RuleCharacterIterator::skipIgnored(chars,local_14c);
  this_00 = local_148;
  if ((local_134 & 2) == 0) {
    if ((local_134 & 4) == 0) goto LAB_002d70db;
    if ((depth & 1U) != 0) {
      pcVar10 = *(code **)(pcVar10 + *(long *)((long)ec + (long)local_148) + -1);
    }
    local_138 = 4;
  }
  else if ((depth & 1U) != 0) {
    pcVar10 = *(code **)(pcVar10 + *(long *)((long)ec + (long)local_148) + -1);
  }
  (*pcVar10)((long)ec + (long)local_148,local_138);
LAB_002d70db:
  if (bVar2) {
    complement(this_00);
  }
  if (bVar1) {
    _generatePattern(this_00,rebuiltPat,'\0');
  }
  else {
    UnicodeString::append(rebuiltPat,&patLocal);
  }
  if (((this_00->fFlags & 1) != 0) &&
     (*(int *)&(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject.
               _vptr_UObject < 1)) {
    *(undefined4 *)
     &(in_stack_00000018->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject = 7;
  }
LAB_002d7147:
  anon_unknown_0::UnicodeSetPointer::~UnicodeSetPointer(&scratch);
  UnicodeString::~UnicodeString(&buf);
  UnicodeString::~UnicodeString(&patLocal);
  return;
}

Assistant:

void UnicodeSet::applyPattern(RuleCharacterIterator& chars,
                              const SymbolTable* symbols,
                              UnicodeString& rebuiltPat,
                              uint32_t options,
                              UnicodeSet& (UnicodeSet::*caseClosure)(int32_t attribute),
                              int32_t depth,
                              UErrorCode& ec) {
    if (U_FAILURE(ec)) return;
    if (depth > MAX_DEPTH) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Syntax characters: [ ] ^ - & { }

    // Recognized special forms for chars, sets: c-c s-s s&s

    int32_t opts = RuleCharacterIterator::PARSE_VARIABLES |
                   RuleCharacterIterator::PARSE_ESCAPES;
    if ((options & USET_IGNORE_SPACE) != 0) {
        opts |= RuleCharacterIterator::SKIP_WHITESPACE;
    }

    UnicodeString patLocal, buf;
    UBool usePat = FALSE;
    UnicodeSetPointer scratch;
    RuleCharacterIterator::Pos backup;

    // mode: 0=before [, 1=between [...], 2=after ]
    // lastItem: 0=none, 1=char, 2=set
    int8_t lastItem = 0, mode = 0;
    UChar32 lastChar = 0;
    UChar op = 0;

    UBool invert = FALSE;

    clear();

    while (mode != 2 && !chars.atEnd()) {
        U_ASSERT((lastItem == 0 && op == 0) ||
                 (lastItem == 1 && (op == 0 || op == HYPHEN /*'-'*/)) ||
                 (lastItem == 2 && (op == 0 || op == HYPHEN /*'-'*/ ||
                                    op == INTERSECTION /*'&'*/)));

        UChar32 c = 0;
        UBool literal = FALSE;
        UnicodeSet* nested = 0; // alias - do not delete

        // -------- Check for property pattern

        // setMode: 0=none, 1=unicodeset, 2=propertypat, 3=preparsed
        int8_t setMode = 0;
        if (resemblesPropertyPattern(chars, opts)) {
            setMode = 2;
        }

        // -------- Parse '[' of opening delimiter OR nested set.
        // If there is a nested set, use `setMode' to define how
        // the set should be parsed.  If the '[' is part of the
        // opening delimiter for this pattern, parse special
        // strings "[", "[^", "[-", and "[^-".  Check for stand-in
        // characters representing a nested set in the symbol
        // table.

        else {
            // Prepare to backup if necessary
            chars.getPos(backup);
            c = chars.next(opts, literal, ec);
            if (U_FAILURE(ec)) return;

            if (c == 0x5B /*'['*/ && !literal) {
                if (mode == 1) {
                    chars.setPos(backup); // backup
                    setMode = 1;
                } else {
                    // Handle opening '[' delimiter
                    mode = 1;
                    patLocal.append((UChar) 0x5B /*'['*/);
                    chars.getPos(backup); // prepare to backup
                    c = chars.next(opts, literal, ec); 
                    if (U_FAILURE(ec)) return;
                    if (c == 0x5E /*'^'*/ && !literal) {
                        invert = TRUE;
                        patLocal.append((UChar) 0x5E /*'^'*/);
                        chars.getPos(backup); // prepare to backup
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                    }
                    // Fall through to handle special leading '-';
                    // otherwise restart loop for nested [], \p{}, etc.
                    if (c == HYPHEN /*'-'*/) {
                        literal = TRUE;
                        // Fall through to handle literal '-' below
                    } else {
                        chars.setPos(backup); // backup
                        continue;
                    }
                }
            } else if (symbols != 0) {
                const UnicodeFunctor *m = symbols->lookupMatcher(c);
                if (m != 0) {
                    const UnicodeSet *ms = dynamic_cast<const UnicodeSet *>(m);
                    if (ms == NULL) {
                        ec = U_MALFORMED_SET;
                        return;
                    }
                    // casting away const, but `nested' won't be modified
                    // (important not to modify stored set)
                    nested = const_cast<UnicodeSet*>(ms);
                    setMode = 3;
                }
            }
        }

        // -------- Handle a nested set.  This either is inline in
        // the pattern or represented by a stand-in that has
        // previously been parsed and was looked up in the symbol
        // table.

        if (setMode != 0) {
            if (lastItem == 1) {
                if (op != 0) {
                    // syntaxError(chars, "Char expected after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastItem = 0;
                op = 0;
            }

            if (op == HYPHEN /*'-'*/ || op == INTERSECTION /*'&'*/) {
                patLocal.append(op);
            }

            if (nested == 0) {
                // lazy allocation
                if (!scratch.allocate()) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                nested = scratch.pointer();
            }
            switch (setMode) {
            case 1:
                nested->applyPattern(chars, symbols, patLocal, options, caseClosure, depth + 1, ec);
                break;
            case 2:
                chars.skipIgnored(opts);
                nested->applyPropertyPattern(chars, patLocal, ec);
                if (U_FAILURE(ec)) return;
                break;
            case 3: // `nested' already parsed
                nested->_toPattern(patLocal, FALSE);
                break;
            }

            usePat = TRUE;

            if (mode == 0) {
                // Entire pattern is a category; leave parse loop
                *this = *nested;
                mode = 2;
                break;
            }

            switch (op) {
            case HYPHEN: /*'-'*/
                removeAll(*nested);
                break;
            case INTERSECTION: /*'&'*/
                retainAll(*nested);
                break;
            case 0:
                addAll(*nested);
                break;
            }

            op = 0;
            lastItem = 2;

            continue;
        }

        if (mode == 0) {
            // syntaxError(chars, "Missing '['");
            ec = U_MALFORMED_SET;
            return;
        }

        // -------- Parse special (syntax) characters.  If the
        // current character is not special, or if it is escaped,
        // then fall through and handle it below.

        if (!literal) {
            switch (c) {
            case 0x5D /*']'*/:
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                // Treat final trailing '-' as a literal
                if (op == HYPHEN /*'-'*/) {
                    add(op, op);
                    patLocal.append(op);
                } else if (op == INTERSECTION /*'&'*/) {
                    // syntaxError(chars, "Trailing '&'");
                    ec = U_MALFORMED_SET;
                    return;
                }
                patLocal.append((UChar) 0x5D /*']'*/);
                mode = 2;
                continue;
            case HYPHEN /*'-'*/:
                if (op == 0) {
                    if (lastItem != 0) {
                        op = (UChar) c;
                        continue;
                    } else {
                        // Treat final trailing '-' as a literal
                        add(c, c);
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x5D /*']'*/ && !literal) {
                            patLocal.append(HYPHEN_RIGHT_BRACE, 2);
                            mode = 2;
                            continue;
                        }
                    }
                }
                // syntaxError(chars, "'-' not after char or set");
                ec = U_MALFORMED_SET;
                return;
            case INTERSECTION /*'&'*/:
                if (lastItem == 2 && op == 0) {
                    op = (UChar) c;
                    continue;
                }
                // syntaxError(chars, "'&' not after set");
                ec = U_MALFORMED_SET;
                return;
            case 0x5E /*'^'*/:
                // syntaxError(chars, "'^' not after '['");
                ec = U_MALFORMED_SET;
                return;
            case 0x7B /*'{'*/:
                if (op != 0) {
                    // syntaxError(chars, "Missing operand after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                lastItem = 0;
                buf.truncate(0);
                {
                    UBool ok = FALSE;
                    while (!chars.atEnd()) {
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x7D /*'}'*/ && !literal) {
                            ok = TRUE;
                            break;
                        }
                        buf.append(c);
                    }
                    if (buf.length() < 1 || !ok) {
                        // syntaxError(chars, "Invalid multicharacter string");
                        ec = U_MALFORMED_SET;
                        return;
                    }
                }
                // We have new string. Add it to set and continue;
                // we don't need to drop through to the further
                // processing
                add(buf);
                patLocal.append((UChar) 0x7B /*'{'*/);
                _appendToPat(patLocal, buf, FALSE);
                patLocal.append((UChar) 0x7D /*'}'*/);
                continue;
            case SymbolTable::SYMBOL_REF:
                //         symbols  nosymbols
                // [a-$]   error    error (ambiguous)
                // [a$]    anchor   anchor
                // [a-$x]  var "x"* literal '$'
                // [a-$.]  error    literal '$'
                // *We won't get here in the case of var "x"
                {
                    chars.getPos(backup);
                    c = chars.next(opts, literal, ec);
                    if (U_FAILURE(ec)) return;
                    UBool anchor = (c == 0x5D /*']'*/ && !literal);
                    if (symbols == 0 && !anchor) {
                        c = SymbolTable::SYMBOL_REF;
                        chars.setPos(backup);
                        break; // literal '$'
                    }
                    if (anchor && op == 0) {
                        if (lastItem == 1) {
                            add(lastChar, lastChar);
                            _appendToPat(patLocal, lastChar, FALSE);
                        }
                        add(U_ETHER);
                        usePat = TRUE;
                        patLocal.append((UChar) SymbolTable::SYMBOL_REF);
                        patLocal.append((UChar) 0x5D /*']'*/);
                        mode = 2;
                        continue;
                    }
                    // syntaxError(chars, "Unquoted '$'");
                    ec = U_MALFORMED_SET;
                    return;
                }
            default:
                break;
            }
        }

        // -------- Parse literal characters.  This includes both
        // escaped chars ("\u4E01") and non-syntax characters
        // ("a").

        switch (lastItem) {
        case 0:
            lastItem = 1;
            lastChar = c;
            break;
        case 1:
            if (op == HYPHEN /*'-'*/) {
                if (lastChar >= c) {
                    // Don't allow redundant (a-a) or empty (b-a) ranges;
                    // these are most likely typos.
                    // syntaxError(chars, "Invalid range");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, c);
                _appendToPat(patLocal, lastChar, FALSE);
                patLocal.append(op);
                _appendToPat(patLocal, c, FALSE);
                lastItem = 0;
                op = 0;
            } else {
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastChar = c;
            }
            break;
        case 2:
            if (op != 0) {
                // syntaxError(chars, "Set expected after operator");
                ec = U_MALFORMED_SET;
                return;
            }
            lastChar = c;
            lastItem = 1;
            break;
        }
    }

    if (mode != 2) {
        // syntaxError(chars, "Missing ']'");
        ec = U_MALFORMED_SET;
        return;
    }

    chars.skipIgnored(opts);

    /**
     * Handle global flags (invert, case insensitivity).  If this
     * pattern should be compiled case-insensitive, then we need
     * to close over case BEFORE COMPLEMENTING.  This makes
     * patterns like /[^abc]/i work.
     */
    if ((options & USET_CASE_INSENSITIVE) != 0) {
        (this->*caseClosure)(USET_CASE_INSENSITIVE);
    }
    else if ((options & USET_ADD_CASE_MAPPINGS) != 0) {
        (this->*caseClosure)(USET_ADD_CASE_MAPPINGS);
    }
    if (invert) {
        complement();
    }

    // Use the rebuilt pattern (patLocal) only if necessary.  Prefer the
    // generated pattern.
    if (usePat) {
        rebuiltPat.append(patLocal);
    } else {
        _generatePattern(rebuiltPat, FALSE);
    }
    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
}